

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O3

void __thiscall InputInterfaceToStream::~InputInterfaceToStream(InputInterfaceToStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IByteReader)._vptr_IByteReader = (_func_int **)&PTR__InputInterfaceToStream_003a5b38;
  (this->super_IReadPositionProvider)._vptr_IReadPositionProvider =
       (_func_int **)&PTR__InputInterfaceToStream_003a5b70;
  pcVar2 = (this->mInput)._M_dataplus._M_p;
  paVar1 = &(this->mInput).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~InputInterfaceToStream(){}